

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O3

void __thiscall
HighsImplications::cleanupVlb
          (HighsImplications *this,HighsInt col,HighsInt vlbCol,VarBound *vlb,double lb,
          bool *redundant,bool *infeasible,bool allowBoundChanges)

{
  double dVar1;
  HighsMipSolverData *pHVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  HighsDomainChange boundchg;
  
  *redundant = false;
  *infeasible = false;
  if (vlbCol != -1) {
    pHVar2 = (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar1 = vlb->coef;
    dVar5 = vlb->constant;
    dVar4 = 0.0;
    if (0.0 <= dVar1) {
      dVar4 = dVar1;
    }
    dVar3 = dVar5 + dVar4;
    dVar3 = (dVar4 - (dVar3 - dVar5)) + (dVar5 - (dVar3 - (dVar3 - dVar5))) + 0.0 + dVar3;
    if (dVar3 <= pHVar2->feastol + lb) {
      *redundant = true;
    }
    else {
      dVar4 = 0.0;
      if (dVar1 <= 0.0) {
        dVar4 = dVar1;
      }
      dVar6 = dVar5 + dVar4;
      dVar6 = (dVar4 - (dVar6 - dVar5)) + (dVar5 - (dVar6 - (dVar6 - dVar5))) + 0.0 + dVar6;
      if (lb - pHVar2->epsilon <= dVar6) {
        if ((allowBoundChanges) && (pHVar2->epsilon + lb < dVar6)) {
          boundchg.column = col;
          boundchg.boundval = dVar6;
          boundchg.boundtype = kLower;
          HighsDomain::changeBound(&pHVar2->domain,boundchg,(Reason)0xfffffffe);
          *infeasible = (((this->mipsolver->mipdata_)._M_t.
                          super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                          .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain)
                        .infeasible_;
        }
      }
      else {
        dVar5 = lb - dVar3;
        dVar5 = (lb - (dVar3 + dVar5)) + (-dVar3 - (dVar5 - (dVar3 + dVar5))) + dVar5;
        if (0.0 <= dVar1) {
          vlb->constant = lb;
          dVar5 = -dVar5;
        }
        vlb->coef = dVar5;
      }
    }
  }
  return;
}

Assistant:

void HighsImplications::cleanupVlb(HighsInt col, HighsInt vlbCol,
                                   HighsImplications::VarBound& vlb, double lb,
                                   bool& redundant, bool& infeasible,
                                   bool allowBoundChanges) const {
  // initialize
  redundant = false;
  infeasible = false;

  // return if there is no variable bound
  if (vlbCol == -1) return;

  // check variable lower bound
  mipsolver.mipdata_->debugSolution.checkVlb(col, vlbCol, vlb.coef,
                                             vlb.constant);

  HighsCDouble maxlb = vlb.maxValue();
  HighsCDouble minlb = vlb.minValue();

  if (maxlb <= lb + mipsolver.mipdata_->feastol) {
    // variable bound is redundant
    redundant = true;
  } else if (minlb < lb - mipsolver.mipdata_->epsilon) {
    // coefficient can be tightened
    double newcoef = static_cast<double>(lb - maxlb);
    if (vlb.coef < 0) {
      vlb.coef = newcoef;
    } else {
      vlb.constant = lb;
      vlb.coef = -newcoef;
    }
    // check tightened variable lower bound
    mipsolver.mipdata_->debugSolution.checkVlb(col, vlbCol, vlb.coef,
                                               vlb.constant);
  } else if (allowBoundChanges && minlb > lb + mipsolver.mipdata_->epsilon) {
    mipsolver.mipdata_->domain.changeBound(HighsBoundType::kLower, col,
                                           static_cast<double>(minlb),
                                           HighsDomain::Reason::unspecified());
    infeasible = mipsolver.mipdata_->domain.infeasible();
  }
}